

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O2

void map_suite::test_string_bool_two(void)

{
  mapped_type *pmVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  value;
  char input [29];
  iarchive in;
  undefined1 local_1ed;
  undefined4 local_1ec;
  key_type local_1e8;
  undefined1 local_1c8 [8];
  _Rb_tree_node_base local_1c0;
  pointer local_1a0;
  char local_198 [32];
  basic_iarchive<char> local_178;
  
  builtin_strncpy(local_198 + 0x10,"ravo\":false}",0xd);
  builtin_strncpy(local_198,"{\"alpha\":true,\"b",0x10);
  local_1c8 = (undefined1  [8])strlen(local_198);
  local_1c0._0_8_ = local_198;
  trial::protocol::json::basic_iarchive<char>::basic_iarchive(&local_178,(view_type *)local_1c8);
  local_1c0._M_left = &local_1c0;
  local_1c0._0_8_ = local_1c0._0_8_ & 0xffffffff00000000;
  local_1c0._M_parent = (_Base_ptr)0x0;
  local_1a0 = (pointer)0x0;
  local_1c0._M_right = local_1c0._M_left;
  trial::protocol::json::basic_iarchive<char>::
  load_override<std::map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>>
            (&local_178,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              *)local_1c8);
  local_1e8._M_dataplus._M_p = local_1a0;
  local_1ec = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,unsigned_int>
            ("value.size()","2U",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x26a,"void map_suite::test_string_bool_two()",&local_1e8,&local_1ec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"alpha",(allocator<char> *)&local_1ec);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                         *)local_1c8,&local_1e8);
  local_1ed = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("value[\"alpha\"]","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x26b,"void map_suite::test_string_bool_two()",pmVar1,&local_1ed);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"bravo",(allocator<char> *)&local_1ec);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                         *)local_1c8,&local_1e8);
  local_1ed = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("value[\"bravo\"]","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/iarchive_suite.cpp"
             ,0x26c,"void map_suite::test_string_bool_two()",pmVar1,&local_1ed);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)local_1c8);
  trial::protocol::json::basic_iarchive<char>::~basic_iarchive(&local_178);
  return;
}

Assistant:

void test_string_bool_two()
{
    const char input[] = "{\"alpha\":true,\"bravo\":false}";
    json::iarchive in(input);
    std::map<std::string, bool> value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value.size(), 2U);
    TRIAL_PROTOCOL_TEST_EQUAL(value["alpha"], true);
    TRIAL_PROTOCOL_TEST_EQUAL(value["bravo"], false);
}